

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

bool P_NoWayTraverse(AActor *usething,DVector2 *start,DVector2 *end)

{
  undefined8 uVar1;
  bool bVar2;
  intercept_t *piVar3;
  double dVar4;
  double dVar5;
  undefined1 local_130 [32];
  FLineOpening open;
  line_t *ld;
  intercept_t *in;
  FPathTraverse it;
  DVector2 *end_local;
  DVector2 *start_local;
  AActor *usething_local;
  
  it._56_8_ = end;
  FPathTraverse::FPathTraverse((FPathTraverse *)&in,start->X,start->Y,end->X,end->Y,1,0.0);
  do {
    do {
      piVar3 = FPathTraverse::Next((FPathTraverse *)&in);
      if (piVar3 == (intercept_t *)0x0) {
        usething_local._7_1_ = false;
        goto LAB_0058dba9;
      }
      open._136_8_ = piVar3->d;
      FLineOpening::FLineOpening((FLineOpening *)(local_130 + 0x18));
    } while (*(int *)(open._136_8_ + 0x28) != 0);
    bVar2 = line_t::isLinePortal((line_t *)open._136_8_);
    uVar1 = open._136_8_;
    if (bVar2) {
      usething_local._7_1_ = false;
      goto LAB_0058dba9;
    }
    if ((*(uint *)(open._136_8_ + 0x20) & 0xc001) != 0) {
      usething_local._7_1_ = true;
      goto LAB_0058dba9;
    }
    FPathTraverse::InterceptPoint((FPathTraverse *)local_130,(intercept_t *)&in);
    P_LineOpening((FLineOpening *)(local_130 + 0x18),(AActor *)0x0,(line_t *)uVar1,
                  (DVector2 *)local_130,(DVector2 *)0x0,0);
    dVar5 = open.top;
  } while (((0.0 < open.bottom) &&
           (dVar4 = AActor::Z(usething), uVar1 = local_130._24_8_,
           dVar5 <= dVar4 + usething->MaxStepHeight)) &&
          (dVar5 = AActor::Top(usething), dVar5 <= (double)uVar1));
  usething_local._7_1_ = true;
LAB_0058dba9:
  local_130._20_4_ = 1;
  FPathTraverse::~FPathTraverse((FPathTraverse *)&in);
  return usething_local._7_1_;
}

Assistant:

bool P_NoWayTraverse(AActor *usething, const DVector2 &start, const DVector2 &end)
{
	FPathTraverse it(start.X, start.Y, end.X, end.Y, PT_ADDLINES);
	intercept_t *in;

	while ((in = it.Next()))
	{
		line_t *ld = in->d.line;
		FLineOpening open;

		// [GrafZahl] de-obfuscated. Was I the only one who was unable to make sense out of
		// this convoluted mess?
		if (ld->special) continue;
		if (ld->isLinePortal()) return false;
		if (ld->flags&(ML_BLOCKING | ML_BLOCKEVERYTHING | ML_BLOCK_PLAYERS)) return true;
		P_LineOpening(open, NULL, ld, it.InterceptPoint(in));
		if (open.range <= 0 ||
			open.bottom > usething->Z() + usething->MaxStepHeight ||
			open.top < usething->Top()) return true;
	}
	return false;
}